

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_4x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  uint8_t uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i bottom_left;
  __m128i top;
  __m128i zero;
  __m128i weight_2;
  __m128i weight_1;
  __m128i weight;
  __m128i inverter;
  __m128i sum_1;
  __m128i alternate_weights_1;
  __m128i inverted_weight_y_1;
  __m128i weight_y_1;
  int y_1;
  __m128i y_select_1;
  __m128i cvtepu8_epi32_1;
  __m128i mask_increment_1;
  __m128i pred_round_1;
  __m128i sum;
  __m128i alternate_weights;
  __m128i inverted_weight_y;
  __m128i weight_y;
  int y;
  __m128i y_select;
  __m128i cvtepu8_epi32;
  __m128i mask_increment;
  __m128i pred_round;
  int val_1;
  int val;
  int val_2;
  int val_3;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  ushort local_898;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  uint8_t *local_710;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  undefined8 local_668;
  undefined8 uStack_660;
  int local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  uint8_t *local_5d0;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  byte local_438;
  undefined1 uStack_437;
  undefined1 uStack_436;
  undefined1 uStack_435;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  undefined4 uStack_78;
  __m128i weights [4];
  __m128i pixels;
  uint8_t *left_column_local;
  uint8_t *top_row_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  uVar2 = *(undefined4 *)top_row;
  uVar1 = left_column[0xf];
  local_438 = (byte)uVar2;
  uStack_437 = (undefined1)((uint)uVar2 >> 8);
  uStack_436 = (undefined1)((uint)uVar2 >> 0x10);
  uStack_435 = (undefined1)((uint)uVar2 >> 0x18);
  local_898 = CONCAT11(0,local_438);
  local_908._0_2_ = 1;
  local_908._2_2_ = 0x1f;
  local_908._4_2_ = 0x3c;
  local_908._6_2_ = 0x56;
  uStack_900._0_2_ = 0x6f;
  uStack_900._2_2_ = 0x85;
  uStack_900._4_2_ = 0x9a;
  uStack_900._6_2_ = 0xac;
  local_8f8._0_1_ = 0x44;
  local_8f8._1_1_ = 0;
  local_8f8._2_1_ = 0x36;
  local_8f8._3_1_ = 0;
  local_8f8._4_1_ = 0x2b;
  local_8f8._5_1_ = 0;
  local_8f8._6_1_ = 0x21;
  local_8f8._7_1_ = 0;
  uStack_8f0._0_1_ = 0x1a;
  uStack_8f0._1_1_ = 0;
  uStack_8f0._2_1_ = 0x14;
  uStack_8f0._3_1_ = 0;
  uStack_8f0._4_1_ = 0x11;
  uStack_8f0._5_1_ = 0;
  uStack_8f0._6_1_ = 0x10;
  uStack_8f0._7_1_ = 0;
  local_8e8._0_2_ = 0xbc;
  local_8e8._2_2_ = 0xca;
  local_8e8._4_2_ = 0xd5;
  local_8e8._6_2_ = 0xdf;
  uStack_8e0._0_2_ = 0xe6;
  uStack_8e0._2_2_ = 0xec;
  uStack_8e0._4_2_ = 0xef;
  uStack_8e0._6_2_ = 0xf0;
  local_618 = 0x100010001000100;
  uStack_610 = 0x100010001000100;
  local_5d0 = dst;
  for (local_61c = 0; local_61c < 8; local_61c = local_61c + 1) {
    auVar11[8] = 0x91;
    auVar11._0_8_ = 0xaa00c400e100ff;
    auVar11[9] = 0;
    auVar11[10] = 0x7b;
    auVar11[0xb] = 0;
    auVar11[0xc] = 0x66;
    auVar11[0xd] = 0;
    auVar11[0xe] = 0x54;
    auVar11[0xf] = 0;
    auVar8._8_8_ = uStack_610;
    auVar8._0_8_ = local_618;
    auVar17 = pshufb(auVar11,auVar8);
    auVar12._8_8_ = uStack_900;
    auVar12._0_8_ = local_908;
    auVar7._8_8_ = uStack_610;
    auVar7._0_8_ = local_618;
    auVar18 = pshufb(auVar12,auVar7);
    local_238 = auVar17._0_2_;
    uStack_236 = auVar17._2_2_;
    uStack_234 = auVar17._4_2_;
    uStack_232 = auVar17._6_2_;
    local_248 = auVar18._0_2_;
    uStack_246 = auVar18._2_2_;
    uStack_244 = auVar18._4_2_;
    uStack_242 = auVar18._6_2_;
    auVar15[2] = uVar1;
    auVar15._0_2_ = local_898;
    auVar15[3] = 0;
    auVar15[4] = uStack_437;
    auVar15[5] = 0;
    auVar15[6] = uVar1;
    auVar15[7] = 0;
    auVar15[8] = uStack_436;
    auVar15[9] = 0;
    auVar15[10] = uVar1;
    auVar15[0xb] = 0;
    auVar15[0xc] = uStack_435;
    auVar15[0xd] = 0;
    auVar15[0xe] = uVar1;
    auVar15[0xf] = 0;
    auVar9._2_2_ = local_248;
    auVar9._0_2_ = local_238;
    auVar9._4_2_ = uStack_236;
    auVar9._6_2_ = uStack_246;
    auVar9._10_2_ = uStack_244;
    auVar9._8_2_ = uStack_234;
    auVar9._12_2_ = uStack_232;
    auVar9._14_2_ = uStack_242;
    auVar17 = pmaddwd(auVar15,auVar9);
    local_198 = auVar17._0_4_;
    iStack_194 = auVar17._4_4_;
    iStack_190 = auVar17._8_4_;
    iStack_18c = auVar17._12_4_;
    auVar17 = ZEXT416(8);
    local_668 = CONCAT44(iStack_194 + 0x80 >> auVar17,local_198 + 0x80 >> auVar17);
    uStack_660._0_4_ = iStack_190 + 0x80 >> auVar17;
    uStack_660._4_4_ = iStack_18c + 0x80 >> auVar17;
    auVar18._8_8_ = uStack_660;
    auVar18._0_8_ = local_668;
    auVar17._8_8_ = 0xc0804000c080400;
    auVar17._0_8_ = 0xc0804000c080400;
    auVar17 = pshufb(auVar18,auVar17);
    uStack_78 = auVar17._0_4_;
    *(undefined4 *)local_5d0 = uStack_78;
    local_5d0 = local_5d0 + stride;
    local_538 = (short)local_618;
    sStack_536 = (short)((ulong)local_618 >> 0x10);
    sStack_534 = (short)((ulong)local_618 >> 0x20);
    sStack_532 = (short)((ulong)local_618 >> 0x30);
    sStack_530 = (short)uStack_610;
    sStack_52e = (short)((ulong)uStack_610 >> 0x10);
    sStack_52c = (short)((ulong)uStack_610 >> 0x20);
    sStack_52a = (short)((ulong)uStack_610 >> 0x30);
    local_618 = CONCAT26(sStack_532 + 0x202,
                         CONCAT24(sStack_534 + 0x202,CONCAT22(sStack_536 + 0x202,local_538 + 0x202))
                        );
    uStack_610 = CONCAT26(sStack_52a + 0x202,
                          CONCAT24(sStack_52c + 0x202,
                                   CONCAT22(sStack_52e + 0x202,sStack_530 + 0x202)));
  }
  local_710 = dst + stride * 8;
  local_758 = 0x100010001000100;
  uStack_750 = 0x100010001000100;
  for (local_75c = 0; local_75c < 8; local_75c = local_75c + 1) {
    auVar13._8_8_ = uStack_8f0;
    auVar13._0_8_ = local_8f8;
    auVar6._8_8_ = uStack_750;
    auVar6._0_8_ = local_758;
    auVar17 = pshufb(auVar13,auVar6);
    auVar14._8_8_ = uStack_8e0;
    auVar14._0_8_ = local_8e8;
    auVar5._8_8_ = uStack_750;
    auVar5._0_8_ = local_758;
    auVar18 = pshufb(auVar14,auVar5);
    local_218 = auVar17._0_2_;
    uStack_216 = auVar17._2_2_;
    uStack_214 = auVar17._4_2_;
    uStack_212 = auVar17._6_2_;
    local_228 = auVar18._0_2_;
    uStack_226 = auVar18._2_2_;
    uStack_224 = auVar18._4_2_;
    uStack_222 = auVar18._6_2_;
    auVar16[2] = uVar1;
    auVar16._0_2_ = local_898;
    auVar16[3] = 0;
    auVar16[4] = uStack_437;
    auVar16[5] = 0;
    auVar16[6] = uVar1;
    auVar16[7] = 0;
    auVar16[8] = uStack_436;
    auVar16[9] = 0;
    auVar16[10] = uVar1;
    auVar16[0xb] = 0;
    auVar16[0xc] = uStack_435;
    auVar16[0xd] = 0;
    auVar16[0xe] = uVar1;
    auVar16[0xf] = 0;
    auVar10._2_2_ = local_228;
    auVar10._0_2_ = local_218;
    auVar10._4_2_ = uStack_216;
    auVar10._6_2_ = uStack_226;
    auVar10._10_2_ = uStack_224;
    auVar10._8_2_ = uStack_214;
    auVar10._12_2_ = uStack_212;
    auVar10._14_2_ = uStack_222;
    auVar17 = pmaddwd(auVar16,auVar10);
    local_178 = auVar17._0_4_;
    iStack_174 = auVar17._4_4_;
    iStack_170 = auVar17._8_4_;
    iStack_16c = auVar17._12_4_;
    auVar17 = ZEXT416(8);
    local_7a8 = CONCAT44(iStack_174 + 0x80 >> auVar17,local_178 + 0x80 >> auVar17);
    uStack_7a0._0_4_ = iStack_170 + 0x80 >> auVar17;
    uStack_7a0._4_4_ = iStack_16c + 0x80 >> auVar17;
    auVar4._8_8_ = uStack_7a0;
    auVar4._0_8_ = local_7a8;
    auVar3._8_8_ = 0xc0804000c080400;
    auVar3._0_8_ = 0xc0804000c080400;
    auVar17 = pshufb(auVar4,auVar3);
    pixels[1]._0_4_ = auVar17._0_4_;
    *(undefined4 *)local_710 = (undefined4)pixels[1];
    local_710 = local_710 + stride;
    local_678 = (short)local_758;
    sStack_676 = (short)((ulong)local_758 >> 0x10);
    sStack_674 = (short)((ulong)local_758 >> 0x20);
    sStack_672 = (short)((ulong)local_758 >> 0x30);
    sStack_670 = (short)uStack_750;
    sStack_66e = (short)((ulong)uStack_750 >> 0x10);
    sStack_66c = (short)((ulong)uStack_750 >> 0x20);
    sStack_66a = (short)((ulong)uStack_750 >> 0x30);
    local_758 = CONCAT26(sStack_672 + 0x202,
                         CONCAT24(sStack_674 + 0x202,CONCAT22(sStack_676 + 0x202,local_678 + 0x202))
                        );
    uStack_750 = CONCAT26(sStack_66a + 0x202,
                          CONCAT24(sStack_66c + 0x202,
                                   CONCAT22(sStack_66e + 0x202,sStack_670 + 0x202)));
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_4x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  __m128i pixels;
  load_smooth_vertical_pixels4(top_row, left_column, 16, &pixels);

  __m128i weights[4];
  load_smooth_vertical_weights4(smooth_weights, 16, weights);

  write_smooth_vertical4xh(&pixels, weights, 8, dst, stride);
  dst += stride << 3;
  write_smooth_vertical4xh(&pixels, &weights[2], 8, dst, stride);
}